

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Expression dynet::expr::contract3d_1d(Expression *x,Expression *y,Expression *b)

{
  initializer_list<dynet::VariableIndex> *in_RCX;
  ComputationGraph *in_RDX;
  undefined8 extraout_RDX;
  undefined8 *in_RSI;
  ComputationGraph *in_RDI;
  Expression EVar1;
  ComputationGraph *pg;
  ComputationGraph *this;
  VariableIndex local_44;
  VariableIndex VStack_40;
  VariableIndex VStack_3c;
  VariableIndex *local_38;
  undefined8 local_30;
  
  pg = (ComputationGraph *)*in_RSI;
  this = in_RDI;
  VariableIndex::VariableIndex(&local_44,(VariableIndex *)(in_RSI + 1));
  VariableIndex::VariableIndex
            (&VStack_40,
             (VariableIndex *)
             &(in_RDX->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  VariableIndex::VariableIndex(&VStack_3c,(VariableIndex *)&in_RCX->_M_len);
  local_38 = &local_44;
  local_30 = 3;
  ComputationGraph::add_function<dynet::InnerProduct3D_1D>(in_RDX,in_RCX);
  Expression::Expression((Expression *)this,pg,(VariableIndex *)in_RDI);
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = this;
  return EVar1;
}

Assistant:

Expression contract3d_1d(const Expression& x, const Expression& y, const Expression& b) { return Expression(x.pg, x.pg->add_function<InnerProduct3D_1D>({x.i, y.i, b.i})); }